

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_io_readWholeFileNamedAsByteArray(sysbvm_context_t *context,sysbvm_tuple_t filename)

{
  char *__filename;
  FILE *__stream;
  size_t sVar1;
  sysbvm_context_t *local_40;
  sysbvm_tuple_t readByteArray;
  size_t fileSize;
  FILE *inputFile;
  char *inputFileName;
  sysbvm_tuple_t filename_local;
  sysbvm_context_t *context_local;
  
  __filename = sysbvm_tuple_bytesToCString(filename);
  __stream = fopen(__filename,"rb");
  if (__stream == (FILE *)0x0) {
    context_local = (sysbvm_context_t *)0x0;
  }
  else {
    sysbvm_tuple_bytesToCStringFree(__filename);
    fseek(__stream,0,2);
    sVar1 = ftell(__stream);
    fseek(__stream,0,0);
    local_40 = (sysbvm_context_t *)sysbvm_byteArray_create(context,sVar1);
    if (((local_40 != (sysbvm_context_t *)0x0) && (sVar1 != 0)) &&
       (sVar1 = fread(&(local_40->heap).shouldAttemptToCollect,sVar1,1,__stream), sVar1 != 1)) {
      local_40 = (sysbvm_context_t *)0x0;
    }
    fclose(__stream);
    context_local = local_40;
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_io_readWholeFileNamedAsByteArray(sysbvm_context_t *context, sysbvm_tuple_t filename)
{
    char *inputFileName = sysbvm_tuple_bytesToCString(filename);
#ifdef _WIN32
    FILE *inputFile = NULL;
    if(fopen_s(&inputFile, inputFileName, "rb"))
        return SYSBVM_NULL_TUPLE;
#else
    FILE *inputFile = fopen(inputFileName, "rb");
#endif
    if(!inputFile)
        return SYSBVM_NULL_TUPLE;
    sysbvm_tuple_bytesToCStringFree(inputFileName);

    fseek(inputFile, 0, SEEK_END);
    size_t fileSize = ftell(inputFile);
    fseek(inputFile, 0, SEEK_SET);

    sysbvm_tuple_t readByteArray = sysbvm_byteArray_create(context, fileSize);
    if(readByteArray && fileSize > 0)
    {
        if(fread(SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(readByteArray)->bytes, fileSize, 1, inputFile) != 1)
            readByteArray = SYSBVM_NULL_TUPLE;
    }

    fclose(inputFile);

    return readByteArray;
}